

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall
FString::Substitute(FString *this,char *oldstr,char *newstr,size_t oldstrlen,size_t newstrlen)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  size_t matchpt;
  size_t len;
  char *match;
  size_t checkpt;
  size_t newstrlen_local;
  size_t oldstrlen_local;
  char *newstr_local;
  char *oldstr_local;
  FString *this_local;
  
  LockBuffer(this);
  match = (char *)0x0;
  while (pcVar1 = (char *)Len(this), match < pcVar1) {
    pcVar1 = strstr(this->Chars + (long)match,oldstr);
    sVar2 = Len(this);
    if (pcVar1 == (char *)0x0) break;
    lVar3 = (long)pcVar1 - (long)this->Chars;
    if (oldstrlen != newstrlen) {
      ReallocBuffer(this,(sVar2 + newstrlen) - oldstrlen);
      memmove(this->Chars + newstrlen + lVar3,this->Chars + oldstrlen + lVar3,
              ((sVar2 + 1) - lVar3) - oldstrlen);
    }
    memcpy(this->Chars + lVar3,newstr,newstrlen);
    match = (char *)(lVar3 + newstrlen);
  }
  UnlockBuffer(this);
  return;
}

Assistant:

void FString::Substitute (const char *oldstr, const char *newstr, size_t oldstrlen, size_t newstrlen)
{
	LockBuffer();
	for (size_t checkpt = 0; checkpt < Len(); )
	{
		char *match = strstr (Chars + checkpt, oldstr);
		size_t len = Len();
		if (match != NULL)
		{
			size_t matchpt = match - Chars;
			if (oldstrlen != newstrlen)
			{
				ReallocBuffer (len + newstrlen - oldstrlen);
				memmove (Chars + matchpt + newstrlen, Chars + matchpt + oldstrlen, (len + 1 - matchpt - oldstrlen)*sizeof(char));
			}
			memcpy (Chars + matchpt, newstr, newstrlen);
			checkpt = matchpt + newstrlen;
		}
		else
		{
			break;
		}
	}
	UnlockBuffer();
}